

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

char * __thiscall
diligent_spirv_cross::CompilerGLSL::to_storage_qualifiers_glsl(CompilerGLSL *this,SPIRVariable *var)

{
  StorageClass SVar1;
  bool bVar2;
  uint32_t location;
  SPIREntryPoint *pSVar3;
  char *pcVar4;
  char *pcVar5;
  
  pSVar3 = Compiler::get_entry_point(&this->super_Compiler);
  bVar2 = subpass_input_is_framebuffer_fetch(this,(var->super_IVariant).self.id);
  if (bVar2) {
    return "";
  }
  SVar1 = var->storage;
  if (SVar1 < Image) {
    if ((0x605U >> (SVar1 & 0x1f) & 1) != 0) {
      return "uniform ";
    }
    if ((10U >> (SVar1 & 0x1f) & 1) != 0) {
      bVar2 = is_legacy(this);
      if ((bVar2) && (pSVar3->model == ExecutionModelVertex)) {
        SVar1 = var->storage;
        pcVar5 = "attribute ";
        pcVar4 = "varying ";
      }
      else {
        bVar2 = is_legacy(this);
        if (bVar2 && pSVar3->model == ExecutionModelFragment) {
          return "varying ";
        }
        SVar1 = var->storage;
        if (SVar1 == Output && pSVar3->model == ExecutionModelFragment) {
          location = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                DecorationLocation);
          bVar2 = location_is_framebuffer_fetch(this,location);
          if (!bVar2) {
            return "out ";
          }
          return "inout ";
        }
        pcVar5 = "in ";
        pcVar4 = "out ";
      }
      if (SVar1 != Input) {
        return pcVar4;
      }
      return pcVar5;
    }
  }
  if (SVar1 == CallableDataKHR) {
    pcVar5 = "callableDataEXT ";
    pcVar4 = "callableDataNV ";
  }
  else if (SVar1 == IncomingCallableDataKHR) {
    pcVar5 = "callableDataInEXT ";
    pcVar4 = "callableDataInNV ";
  }
  else if (SVar1 == RayPayloadKHR) {
    pcVar5 = "rayPayloadEXT ";
    pcVar4 = "rayPayloadNV ";
  }
  else if (SVar1 == HitAttributeKHR) {
    pcVar5 = "hitAttributeEXT ";
    pcVar4 = "hitAttributeNV ";
  }
  else {
    if (SVar1 != IncomingRayPayloadKHR) {
      return "";
    }
    pcVar5 = "rayPayloadInEXT ";
    pcVar4 = "rayPayloadInNV ";
  }
  if (this->ray_tracing_is_khr != false) {
    pcVar4 = pcVar5;
  }
  return pcVar4;
}

Assistant:

const char *CompilerGLSL::to_storage_qualifiers_glsl(const SPIRVariable &var)
{
	auto &execution = get_entry_point();

	if (subpass_input_is_framebuffer_fetch(var.self))
		return "";

	if (var.storage == StorageClassInput || var.storage == StorageClassOutput)
	{
		if (is_legacy() && execution.model == ExecutionModelVertex)
			return var.storage == StorageClassInput ? "attribute " : "varying ";
		else if (is_legacy() && execution.model == ExecutionModelFragment)
			return "varying "; // Fragment outputs are renamed so they never hit this case.
		else if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
		{
			uint32_t loc = get_decoration(var.self, DecorationLocation);
			bool is_inout = location_is_framebuffer_fetch(loc);
			if (is_inout)
				return "inout ";
			else
				return "out ";
		}
		else
			return var.storage == StorageClassInput ? "in " : "out ";
	}
	else if (var.storage == StorageClassUniformConstant || var.storage == StorageClassUniform ||
	         var.storage == StorageClassPushConstant || var.storage == StorageClassAtomicCounter)
	{
		return "uniform ";
	}
	else if (var.storage == StorageClassRayPayloadKHR)
	{
		return ray_tracing_is_khr ? "rayPayloadEXT " : "rayPayloadNV ";
	}
	else if (var.storage == StorageClassIncomingRayPayloadKHR)
	{
		return ray_tracing_is_khr ? "rayPayloadInEXT " : "rayPayloadInNV ";
	}
	else if (var.storage == StorageClassHitAttributeKHR)
	{
		return ray_tracing_is_khr ? "hitAttributeEXT " : "hitAttributeNV ";
	}
	else if (var.storage == StorageClassCallableDataKHR)
	{
		return ray_tracing_is_khr ? "callableDataEXT " : "callableDataNV ";
	}
	else if (var.storage == StorageClassIncomingCallableDataKHR)
	{
		return ray_tracing_is_khr ? "callableDataInEXT " : "callableDataInNV ";
	}

	return "";
}